

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O1

void * sc_core::sc_event_timed::allocate(void)

{
  undefined1 auVar1 [16];
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  long lVar5;
  
  if (free_list == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)malloc(0x400);
    auVar1 = _DAT_0021e870;
    lVar3 = 0;
    auVar4 = _DAT_0021e860;
    free_list = puVar2;
    do {
      lVar5 = auVar4._8_8_;
      if (SUB164(auVar4 ^ auVar1,4) == -0x80000000 && SUB164(auVar4 ^ auVar1,0) < -0x7fffffc1) {
        *(undefined8 **)((long)puVar2 + lVar3) = puVar2 + (auVar4._0_8_ + 1) * 2;
        *(undefined8 **)((long)puVar2 + lVar3 + 0x10) = puVar2 + (lVar5 + 1) * 2;
      }
      auVar4._0_8_ = auVar4._0_8_ + 2;
      auVar4._8_8_ = lVar5 + 2;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0x400);
    puVar2[0x7e] = 0;
  }
  puVar2 = free_list;
  free_list = (undefined8 *)*free_list;
  return puVar2;
}

Assistant:

void*
sc_event_timed::allocate()
{
    const int ALLOC_SIZE = 64;

    if( free_list == 0 ) {
        free_list = (sc_event_timed_u*) malloc( ALLOC_SIZE *
                                                sizeof( sc_event_timed_u ) );
        int i = 0;
        for( ; i < ALLOC_SIZE - 1; ++ i ) {
            free_list[i].next = &free_list[i + 1];
        }
        free_list[i].next = 0;
    }

    sc_event_timed_u* q = free_list;
    free_list = free_list->next;
    return q;
}